

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementAssembly::~IfcElementAssembly(IfcElementAssembly *this)

{
  undefined1 *puVar1;
  IfcElement *this_00;
  long *plVar2;
  long lVar3;
  
  lVar3 = *(long *)(*(long *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject + -0x18);
  this_00 = (IfcElement *)
            (&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x0 + lVar3);
  plVar2 = (long *)((this->PredefinedType).field_2._M_local_buf + lVar3);
  plVar2[-0x30] = 0x91c500;
  plVar2[2] = 0x91c5f0;
  plVar2[-0x1f] = 0x91c528;
  plVar2[-0x1d] = 0x91c550;
  plVar2[-0x16] = 0x91c578;
  plVar2[-0x10] = 0x91c5a0;
  plVar2[-9] = 0x91c5c8;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  puVar1 = &this_00[1].super_IfcProduct.super_IfcObject.field_0x8;
  if (*(undefined1 **)&this_00->field_0x148 != puVar1) {
    operator_delete(*(undefined1 **)&this_00->field_0x148,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__0091c608);
  operator_delete(this_00,0x1a8);
  return;
}

Assistant:

IfcElementAssembly() : Object("IfcElementAssembly") {}